

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_pigpiod_if.c
# Opt level: O0

void t3(void)

{
  int t_00;
  int st;
  int got;
  int t;
  float off;
  float on;
  int v;
  int rr;
  int f;
  int dc [4];
  int pw [3];
  char *in_stack_ffffffffffffffb8;
  int local_40;
  float in_stack_ffffffffffffffc4;
  float in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  int in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_c;
  undefined4 local_4;
  
  local_c = 0x5dc000001f4;
  local_4 = 0x9c4;
  local_28 = 0x2800000014;
  local_20 = 0x500000003c;
  printf("PWM/Servo pulse accuracy tests.\n");
  callback(0x19,2,t3cbf);
  for (local_40 = 0; local_40 < 3; local_40 = local_40 + 1) {
    set_servo_pulsewidth(0x19,*(undefined4 *)((long)&local_c + (long)local_40 * 4));
    in_stack_ffffffffffffffcc = get_servo_pulsewidth(0x19);
    CHECK(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,
          (int)in_stack_ffffffffffffffc8,(int)in_stack_ffffffffffffffc4,in_stack_ffffffffffffffb8);
    time_sleep(0x3ff0000000000000);
    t3_reset = 1;
    time_sleep(0x4010000000000000);
    in_stack_ffffffffffffffc4 = t3_off;
    in_stack_ffffffffffffffc8 = t3_on;
    CHECK(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,(int)t3_on,
          (int)t3_off,in_stack_ffffffffffffffb8);
  }
  set_servo_pulsewidth(0x19,0);
  set_PWM_frequency(0x19,1000);
  t_00 = get_PWM_frequency(0x19);
  CHECK(t_00,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,(int)in_stack_ffffffffffffffc8,
        (int)in_stack_ffffffffffffffc4,in_stack_ffffffffffffffb8);
  st = set_PWM_range(0x19,100);
  CHECK(t_00,st,in_stack_ffffffffffffffcc,(int)in_stack_ffffffffffffffc8,
        (int)in_stack_ffffffffffffffc4,in_stack_ffffffffffffffb8);
  for (local_40 = 0; local_40 < 4; local_40 = local_40 + 1) {
    set_PWM_dutycycle(0x19,*(undefined4 *)((long)&local_28 + (long)local_40 * 4));
    got = get_PWM_dutycycle(0x19);
    CHECK(t_00,st,got,(int)in_stack_ffffffffffffffc8,(int)in_stack_ffffffffffffffc4,
          in_stack_ffffffffffffffb8);
    time_sleep(0x3ff0000000000000);
    t3_reset = 1;
    time_sleep(0x4000000000000000);
    in_stack_ffffffffffffffc4 = t3_off;
    in_stack_ffffffffffffffc8 = t3_on;
    CHECK(t_00,st,got,(int)t3_on,(int)t3_off,in_stack_ffffffffffffffb8);
  }
  set_PWM_dutycycle(0x19,0);
  return;
}

Assistant:

void t3()
{
   int pw[3]={500, 1500, 2500};
   int dc[4]={20, 40, 60, 80};

   int f, rr, v;
   float on, off;

   int t;

   printf("PWM/Servo pulse accuracy tests.\n");

   callback(GPIO, EITHER_EDGE, t3cbf);

   for (t=0; t<3; t++)
   {
      set_servo_pulsewidth(GPIO, pw[t]);
      v = get_servo_pulsewidth(GPIO);
      CHECK(3, t+t+1, v, pw[t], 0, "get servo pulsewidth");

      time_sleep(1);
      t3_reset = 1;
      time_sleep(4);
      on = t3_on;
      off = t3_off;
      CHECK(3, t+t+2, (1000.0*(on+off))/on, 20000000.0/pw[t], 1,
         "set servo pulsewidth");
   }

   set_servo_pulsewidth(GPIO, 0);
   set_PWM_frequency(GPIO, 1000);
   f = get_PWM_frequency(GPIO);
   CHECK(3, 7, f, 1000, 0, "set/get PWM frequency");

   rr = set_PWM_range(GPIO, 100);
   CHECK(3, 8, rr, 200, 0, "set PWM range");

   for (t=0; t<4; t++)
   {
      set_PWM_dutycycle(GPIO, dc[t]);
      v = get_PWM_dutycycle(GPIO);
      CHECK(3, t+t+9, v, dc[t], 0, "get PWM dutycycle");

      time_sleep(1);
      t3_reset = 1;
      time_sleep(2);
      on = t3_on;
      off = t3_off;
      CHECK(3, t+t+10, (1000.0*on)/(on+off), 10.0*dc[t], 1,
         "set PWM dutycycle");
   }

   set_PWM_dutycycle(GPIO, 0);

}